

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_json_mapping_base.h
# Opt level: O2

void __thiscall
cfd::core::JsonObjectVector<cfd::api::json::DecodePsbtInput,_DecodePsbtInputStruct>::
ConvertFromStruct(JsonObjectVector<cfd::api::json::DecodePsbtInput,_DecodePsbtInputStruct> *this,
                 vector<DecodePsbtInputStruct,_std::allocator<DecodePsbtInputStruct>_> *list)

{
  pointer pDVar1;
  pointer data;
  DecodePsbtInput object;
  DecodePsbtInput DStack_488;
  
  pDVar1 = (list->super__Vector_base<DecodePsbtInputStruct,_std::allocator<DecodePsbtInputStruct>_>)
           ._M_impl.super__Vector_impl_data._M_finish;
  for (data = (list->
              super__Vector_base<DecodePsbtInputStruct,_std::allocator<DecodePsbtInputStruct>_>).
              _M_impl.super__Vector_impl_data._M_start; data != pDVar1; data = data + 1) {
    cfd::api::json::DecodePsbtInput::DecodePsbtInput(&DStack_488);
    cfd::api::json::DecodePsbtInput::ConvertFromStruct(&DStack_488,data);
    ::std::vector<cfd::api::json::DecodePsbtInput,_std::allocator<cfd::api::json::DecodePsbtInput>_>
    ::push_back(&(this->super_JsonVector<cfd::api::json::DecodePsbtInput>).
                 super_vector<cfd::api::json::DecodePsbtInput,_std::allocator<cfd::api::json::DecodePsbtInput>_>
                ,&DStack_488);
    cfd::api::json::DecodePsbtInput::~DecodePsbtInput(&DStack_488);
  }
  return;
}

Assistant:

void ConvertFromStruct(const std::vector<STRUCT_TYPE>& list) {
    for (const auto& element : list) {
      TYPE object;
      object.ConvertFromStruct(element);
      std::vector<TYPE>::push_back(object);
    }
  }